

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

iterator __thiscall
roaring::Roaring64Map::ensureRangePopulated
          (Roaring64Map *this,uint32_t start_high,uint32_t end_high)

{
  iterator __pos;
  _Base_ptr p_Var1;
  const_iterator cVar2;
  runtime_error *this_00;
  ulong uVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  tuple<> local_49;
  uint32_t start_high_local;
  uint local_44;
  _Base_ptr local_40;
  _Head_base<0UL,_unsigned_int_&&,_false> local_38;
  
  start_high_local = start_high;
  if (start_high <= end_high) {
    __pos = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
            ::lower_bound((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                           *)this,&start_high_local);
    local_40 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var5 = (_Base_ptr)0x0;
    uVar3 = (ulong)start_high_local;
    uVar4 = uVar3;
    for (; uVar3 <= end_high; uVar3 = uVar3 + 1) {
      if ((__pos._M_node == local_40) || (uVar3 != __pos._M_node[1]._M_color)) {
        local_44 = (uint)uVar3;
        local_38._M_head_impl = &local_44;
        cVar2._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
             ::
             _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_int&&>,std::tuple<>>
                       ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
                         *)this,__pos._M_node,(piecewise_construct_t *)&std::piecewise_construct,
                        (tuple<unsigned_int_&&> *)&local_38,&local_49);
        *(byte *)&cVar2._M_node[2]._M_parent =
             *(byte *)&cVar2._M_node[2]._M_parent & 0xfe | this->copyOnWrite;
        uVar4 = (ulong)start_high_local;
      }
      else {
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(__pos._M_node);
        cVar2._M_node = __pos._M_node;
        __pos._M_node = p_Var1;
      }
      if (uVar3 == uVar4) {
        p_Var5 = cVar2._M_node;
      }
    }
    return (iterator)p_Var5;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Logic error: start_high > end_high");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

roarings_t::iterator ensureRangePopulated(uint32_t start_high,
                                              uint32_t end_high) {
        if (start_high > end_high) {
            ROARING_TERMINATE("Logic error: start_high > end_high");
        }
        // next_populated_iter points to the first entry in the outer map with
        // key >= start_high, or end().
        auto next_populated_iter = roarings.lower_bound(start_high);

        // Use uint64_t to avoid an infinite loop when end_high == uint32_max.
        roarings_t::iterator start_iter{};  // Definitely assigned in loop.
        for (uint64_t slot = start_high; slot <= end_high; ++slot) {
            roarings_t::iterator slot_iter;
            if (next_populated_iter != roarings.end() &&
                next_populated_iter->first == slot) {
                // 'slot' index has caught up to next_populated_iter.
                // Note it here and advance next_populated_iter.
                slot_iter = next_populated_iter++;
            } else {
                // 'slot' index has not yet caught up to next_populated_iter.
                // Make a fresh entry {key = 'slot', value = Roaring()}, insert
                // it just prior to next_populated_iter, and set its copy
                // on write flag. We take pains to use emplace_hint and
                // piecewise_construct to minimize effort.
                slot_iter = roarings.emplace_hint(
                    next_populated_iter, std::piecewise_construct,
                    std::forward_as_tuple(uint32_t(slot)),
                    std::forward_as_tuple());
                auto &bitmap = slot_iter->second;
                bitmap.setCopyOnWrite(copyOnWrite);
            }

            // Make a note of the iterator of the starting slot. It will be
            // needed for the return value.
            if (slot == start_high) {
                start_iter = slot_iter;
            }
        }
        return start_iter;
    }